

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tetrahedralized_Volume_3D.cpp
# Opt level: O2

T_Element * __thiscall
Nova::Tetrahedralized_Volume<float,_3>::Get_Element
          (T_Element *__return_storage_ptr__,Tetrahedralized_Volume<float,_3> *this,int id)

{
  Vector<int,_4,_true> *pVVar1;
  Vector<float,_3,_true> *x1;
  Vector<float,_3,_true> *x2;
  Vector<float,_3,_true> *x3;
  Vector<float,_3,_true> *x4;
  
  if ((-1 < id) &&
     ((ulong)(uint)id <
      (ulong)((long)(this->super_Simplex_Mesh<4>).elements._data.
                    super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_Simplex_Mesh<4>).elements._data.
                    super__Vector_base<Nova::Vector<int,_4,_true>,_std::allocator<Nova::Vector<int,_4,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    pVVar1 = Array<Nova::Vector<int,_4,_true>_>::operator()
                       (&(this->super_Simplex_Mesh<4>).elements,id);
    x1 = Array<Nova::Vector<float,_3,_true>_>::operator()
                   ((Array<Nova::Vector<float,_3,_true>_> *)this,(pVVar1->_data)._M_elems[0]);
    x2 = Array<Nova::Vector<float,_3,_true>_>::operator()
                   ((Array<Nova::Vector<float,_3,_true>_> *)this,(pVVar1->_data)._M_elems[1]);
    x3 = Array<Nova::Vector<float,_3,_true>_>::operator()
                   ((Array<Nova::Vector<float,_3,_true>_> *)this,(pVVar1->_data)._M_elems[2]);
    x4 = Array<Nova::Vector<float,_3,_true>_>::operator()
                   ((Array<Nova::Vector<float,_3,_true>_> *)this,(pVVar1->_data)._M_elems[3]);
    Tetrahedron<float>::Tetrahedron(__return_storage_ptr__,x1,x2,x3,x4);
    return __return_storage_ptr__;
  }
  __assert_fail("id>=0 && id<elements.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/src/Topology_Based_Geometry/Tetrahedralized_Volume_3D.cpp"
                ,0x24,
                "typename Nova::Tetrahedralized_Volume_Policy<T, d>::T_Element Nova::Tetrahedralized_Volume<float, 3>::Get_Element(const int) const [T = float, d = 3]"
               );
}

Assistant:

typename Nova::Tetrahedralized_Volume_Policy<T,d>::T_Element Nova::Tetrahedralized_Volume<T,d>::
Get_Element(const int id) const
{
    assert(id>=0 && id<elements.size());
    const INDEX& e=elements(id);
    return T_Element(points(e(0)),points(e(1)),points(e(2)),points(e(3)));
}